

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O1

void square_add_glyph(chunk_conflict *c,loc grid,wchar_t type)

{
  trap_kind_conflict *ptVar1;
  
  if (type == L'\x02') {
    ptVar1 = lookup_trap("decoy");
    c->decoy = grid;
  }
  else {
    if (type != L'\x01') {
      msg("Non-existent glyph requested. Please report this bug.");
      return;
    }
    ptVar1 = lookup_trap("glyph of warding");
  }
  place_trap((chunk *)c,grid,ptVar1->tidx,L'\0');
  return;
}

Assistant:

void square_add_glyph(struct chunk *c, struct loc grid, int type)
{
	struct trap_kind *glyph = NULL;
	switch (type) {
		case GLYPH_WARDING: {
			glyph = lookup_trap("glyph of warding");
			break;
		}
		case GLYPH_DECOY: {
			glyph = lookup_trap("decoy");
			c->decoy = grid;
			break;
		}
		default: {
			msg("Non-existent glyph requested. Please report this bug.");
			return;
		}
	}
	place_trap(c, grid, glyph->tidx, 0);
}